

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O1

string * anon_unknown.dwarf_110eda::getString(string *__return_storage_ptr__,string *filename)

{
  istream *piVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_240 = &local_230;
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    piVar1 = std::operator>>((istream *)local_220,(string *)&local_240);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_240 == &local_230) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_230._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_240;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]);
      }
      psVar2 = &local_238;
      __return_storage_ptr__->_M_string_length = local_238;
      paVar3 = &local_230;
      local_240 = &local_230;
      goto LAB_00125d01;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = &__return_storage_ptr__->_M_string_length;
  paVar3 = &__return_storage_ptr__->field_2;
LAB_00125d01:
  *psVar2 = 0;
  paVar3->_M_local_buf[0] = '\0';
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

string getString(const string& filename)
{
  ifstream file(filename);
  string str;

  // Read the first string,
  // stops at any space character
  if (file && (file >> str))
    return str;
  else
    return {};
}